

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GLSL420Pack::GLSLTestBase::testDrawArray(GLSLTestBase *this,bool use_version_400)

{
  bool bVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  RenderContext *pRVar3;
  undefined4 extraout_var_00;
  Functions *gl;
  GLchar *sampler_name;
  MessageBuilder message;
  shaderCompilationException *exc;
  programLinkageException *exc_1;
  undefined1 local_160 [8];
  shaderSource vertex_data;
  shaderSource tess_eval_data;
  shaderSource tess_ctrl_data;
  shaderSource geometry_data;
  shaderSource fragment_data;
  buffer vertex_buffer;
  vertexArray vao;
  texture source_tex;
  program program;
  undefined1 local_48 [8];
  framebuffer framebuffer;
  texture color_tex;
  bool result;
  bool use_version_400_local;
  GLSLTestBase *this_local;
  
  Utils::texture::texture
            ((texture *)&framebuffer.m_context,(this->super_TestBase).super_TestCase.m_context);
  Utils::framebuffer::framebuffer
            ((framebuffer *)local_48,(this->super_TestBase).super_TestCase.m_context);
  Utils::program::program
            ((program *)&source_tex.m_texture_type,(this->super_TestBase).super_TestCase.m_context);
  Utils::texture::texture((texture *)&vao.m_context,(this->super_TestBase).super_TestCase.m_context)
  ;
  Utils::vertexArray::vertexArray
            ((vertexArray *)&vertex_buffer.m_target,(this->super_TestBase).super_TestCase.m_context)
  ;
  Utils::buffer::buffer
            ((buffer *)&fragment_data.m_use_lengths,(this->super_TestBase).super_TestCase.m_context)
  ;
  Utils::shaderSource::shaderSource((shaderSource *)&geometry_data.m_use_lengths);
  Utils::shaderSource::shaderSource((shaderSource *)&tess_ctrl_data.m_use_lengths);
  Utils::shaderSource::shaderSource((shaderSource *)&tess_eval_data.m_use_lengths);
  Utils::shaderSource::shaderSource((shaderSource *)&vertex_data.m_use_lengths);
  Utils::shaderSource::shaderSource((shaderSource *)local_160);
  TestBase::initShaderSource
            (&this->super_TestBase,FRAGMENT_SHADER,use_version_400,
             (shaderSource *)&geometry_data.m_use_lengths);
  TestBase::initShaderSource
            (&this->super_TestBase,GEOMETRY_SHADER,use_version_400,
             (shaderSource *)&tess_ctrl_data.m_use_lengths);
  TestBase::initShaderSource
            (&this->super_TestBase,TESS_CTRL_SHADER,use_version_400,
             (shaderSource *)&tess_eval_data.m_use_lengths);
  TestBase::initShaderSource
            (&this->super_TestBase,TESS_EVAL_SHADER,use_version_400,
             (shaderSource *)&vertex_data.m_use_lengths);
  TestBase::initShaderSource
            (&this->super_TestBase,VERTEX_SHADER,use_version_400,(shaderSource *)local_160);
  Utils::shaderSource::shaderSource((shaderSource *)&exc_1,(GLchar *)0x0);
  Utils::program::build
            ((program *)&source_tex.m_texture_type,(shaderSource *)&exc_1,
             (shaderSource *)&geometry_data.m_use_lengths,
             (shaderSource *)&tess_ctrl_data.m_use_lengths,
             (shaderSource *)&tess_eval_data.m_use_lengths,
             (shaderSource *)&vertex_data.m_use_lengths,(shaderSource *)local_160,(GLchar **)0x0,0,
             false);
  Utils::shaderSource::~shaderSource((shaderSource *)&exc_1);
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xd])
            (this,&source_tex.m_texture_type,&fragment_data.m_use_lengths,&vertex_buffer.m_target);
  Utils::program::use((program *)&source_tex.m_texture_type);
  prepareFramebuffer(this,(framebuffer *)local_48,(texture *)&framebuffer.m_context);
  iVar2 = (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xc])
                    (this,&vao.m_context);
  if ((GLchar *)CONCAT44(extraout_var,iVar2) != (GLchar *)0x0) {
    bindTextureToSampler
              (this,(program *)&source_tex.m_texture_type,(texture *)&vao.m_context,
               (GLchar *)CONCAT44(extraout_var,iVar2));
  }
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[8])
            (this,&source_tex.m_texture_type);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestBase).super_TestCase.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x538))(0xe,0,1);
  err = (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x800))();
  glu::checkError(err,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x898);
  bVar1 = checkResults(this,(texture *)&framebuffer.m_context);
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xf])();
  Utils::shaderSource::~shaderSource((shaderSource *)local_160);
  Utils::shaderSource::~shaderSource((shaderSource *)&vertex_data.m_use_lengths);
  Utils::shaderSource::~shaderSource((shaderSource *)&tess_eval_data.m_use_lengths);
  Utils::shaderSource::~shaderSource((shaderSource *)&tess_ctrl_data.m_use_lengths);
  Utils::shaderSource::~shaderSource((shaderSource *)&geometry_data.m_use_lengths);
  Utils::buffer::~buffer((buffer *)&fragment_data.m_use_lengths);
  Utils::vertexArray::~vertexArray((vertexArray *)&vertex_buffer.m_target);
  Utils::texture::~texture((texture *)&vao.m_context);
  Utils::program::~program((program *)&source_tex.m_texture_type);
  Utils::framebuffer::~framebuffer((framebuffer *)local_48);
  Utils::texture::~texture((texture *)&framebuffer.m_context);
  return bVar1;
}

Assistant:

bool GLSLTestBase::testDrawArray(bool use_version_400)
{
	/* Test Result */
	bool result = true;

	/* GL objects */
	Utils::texture	 color_tex(m_context);
	Utils::framebuffer framebuffer(m_context);
	Utils::program	 program(m_context);
	Utils::texture	 source_tex(m_context);
	Utils::vertexArray vao(m_context);
	Utils::buffer	  vertex_buffer(m_context);

	/* Shaders */
	Utils::shaderSource fragment_data;
	Utils::shaderSource geometry_data;
	Utils::shaderSource tess_ctrl_data;
	Utils::shaderSource tess_eval_data;
	Utils::shaderSource vertex_data;

	initShaderSource(Utils::FRAGMENT_SHADER, use_version_400, fragment_data);
	initShaderSource(Utils::GEOMETRY_SHADER, use_version_400, geometry_data);
	initShaderSource(Utils::TESS_CTRL_SHADER, use_version_400, tess_ctrl_data);
	initShaderSource(Utils::TESS_EVAL_SHADER, use_version_400, tess_eval_data);
	initShaderSource(Utils::VERTEX_SHADER, use_version_400, vertex_data);

	/* Build program */
	try
	{
		program.build(0 /* compute shader */, fragment_data, geometry_data, tess_ctrl_data, tess_eval_data, vertex_data,
					  0 /* varying names */, 0 /* n varying names */, false);
	}
	catch (Utils::shaderCompilationException& exc)
	{
		/* Something wrong with compilation, test case failed */
		tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		message << "Shader compilation failed. Error message: " << exc.m_error_message;

		Utils::program::printShaderSource(exc.m_shader_source, message);

		message << tcu::TestLog::EndMessage;

		return false;
	}
	catch (Utils::programLinkageException& exc)
	{
		/* Something wrong with linking, test case failed */
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Program linking failed. Error message: " << exc.m_error_message
											<< tcu::TestLog::EndMessage;
		return false;
	}

/* Log shaders, for debugging */
#if IS_DEBUG
	{
		const Utils::shaderSource* data[] = { &vertex_data, &tess_ctrl_data, &tess_eval_data, &geometry_data,
											  &fragment_data };

		tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		for (GLuint i = 0; i < 5; ++i)
		{
			Utils::program::printShaderSource(*data[i], message);
		}

		message << tcu::TestLog::EndMessage;
	}
#endif /* IS_DEBUG */

	/* Test specific preparation of vertex buffer and vao*/
	prepareVertexBuffer(program, vertex_buffer, vao);

	/* Set current program */
	program.use();

	/* Prepare framebuffer */
	prepareFramebuffer(framebuffer, color_tex);

	/* Test specific preparation of source texture */
	const GLchar* sampler_name = prepareSourceTexture(source_tex);
	if (0 != sampler_name)
	{
		bindTextureToSampler(program, source_tex, sampler_name);
	}

	/* Set up uniforms */
	prepareUniforms(program);

	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Draw */
	gl.drawArrays(GL_PATCHES, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	/* Return result of verification */
	result = checkResults(color_tex);

	/* Release extra resource for the test */
	releaseResource();

	return result;
}